

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void sumprobs(obj_info *info,int bound,char *name)

{
  obj_info *poVar1;
  
  poVar1 = info;
  while (poVar1 + 1 < info + bound) {
    poVar1[1].oi_prob = poVar1[1].oi_prob + poVar1->oi_prob;
    poVar1 = poVar1 + 1;
  }
  return;
}

Assistant:

void sumprobs(struct obj_info *info, int bound, const char *name)
{
#ifdef DEBUG
    struct obj_info *start = info;
#endif
    struct obj_info *endp;

    endp = info + bound;
    while (++info < endp)
        info->oi_prob += (info - 1)->oi_prob;
#ifdef DEBUG
    badcheck(name, start, bound);
#endif
}